

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O1

int __thiscall helics::tcp::TcpCommsSS::processIncomingMessage(TcpCommsSS *this,ActionMessage *cmd)

{
  action_t aVar1;
  bool bVar2;
  int iVar3;
  
  aVar1 = cmd->messageAction;
  bVar2 = true;
  if (((aVar1 != cmd_protocol_priority) && (aVar1 != cmd_protocol)) && (aVar1 != cmd_protocol_big))
  {
    bVar2 = false;
  }
  if ((!bVar2) || (iVar3 = -1, cmd->messageID != 0x16570bf)) {
    if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.super__Function_base
        ._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback._M_invoker)
              ((_Any_data *)&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback
               ,cmd);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int TcpCommsSS::processIncomingMessage(ActionMessage&& cmd)
{
    if (isProtocolCommand(cmd)) {
        switch (cmd.messageID) {
            case CLOSE_RECEIVER:
                return (-1);
            default:
                break;
        }
    }
    ActionCallback(std::move(cmd));
    return 0;
}